

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

void secp256k1_ge_to_storage(secp256k1_ge_storage *r,secp256k1_ge *a)

{
  void *in_RSI;
  secp256k1_fe_storage *in_RDI;
  secp256k1_fe y;
  secp256k1_fe x;
  secp256k1_fe local_60;
  secp256k1_fe local_38;
  void *local_10;
  secp256k1_fe_storage *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  secp256k1_ge_verify((secp256k1_ge *)0x47afd8);
  memcpy(&local_38,local_10,0x28);
  secp256k1_fe_impl_normalize(&local_38);
  memcpy(&local_60,(void *)((long)local_10 + 0x28),0x28);
  secp256k1_fe_impl_normalize(&local_60);
  secp256k1_fe_impl_to_storage(local_8,&local_38);
  secp256k1_fe_impl_to_storage(local_8 + 1,&local_60);
  return;
}

Assistant:

static void secp256k1_ge_to_storage(secp256k1_ge_storage *r, const secp256k1_ge *a) {
    secp256k1_fe x, y;
    SECP256K1_GE_VERIFY(a);
    VERIFY_CHECK(!a->infinity);

    x = a->x;
    secp256k1_fe_normalize(&x);
    y = a->y;
    secp256k1_fe_normalize(&y);
    secp256k1_fe_to_storage(&r->x, &x);
    secp256k1_fe_to_storage(&r->y, &y);
}